

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5SegIterLoadTerm(Fts5Index *p,Fts5SegIter *pIter,int nKeep)

{
  Fts5Data *pFVar1;
  u8 *puVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int nExtra;
  int nNew;
  u32 local_38;
  u32 local_34;
  
  pFVar1 = pIter->pLeaf;
  puVar2 = pFVar1->p;
  iVar5 = pIter->iLeafOffset;
  iVar3 = sqlite3Fts5GetVarint32(puVar2 + iVar5,&local_34);
  lVar4 = (long)iVar3 + (long)iVar5;
  iVar5 = (int)lVar4 + local_34;
  if (((iVar5 <= pFVar1->szLeaf) && (local_34 != 0)) && (nKeep <= (pIter->term).n)) {
    (pIter->term).n = nKeep;
    sqlite3Fts5BufferAppendBlob(&p->rc,&pIter->term,local_34,puVar2 + lVar4);
    pIter->iTermLeafOffset = iVar5;
    pIter->iTermLeafPgno = pIter->iLeafPgno;
    pIter->iLeafOffset = iVar5;
    iVar5 = pIter->iPgidxOff;
    iVar3 = pIter->pLeaf->nn;
    if (iVar5 < iVar3) {
      iVar3 = sqlite3Fts5GetVarint32(puVar2 + iVar5,&local_38);
      pIter->iPgidxOff = iVar3 + iVar5;
      pIter->iEndofDoclist = pIter->iEndofDoclist + local_38;
    }
    else {
      pIter->iEndofDoclist = iVar3 + 1;
    }
    fts5SegIterLoadRowid(p,pIter);
    return;
  }
  p->rc = 0x10b;
  return;
}

Assistant:

static void fts5SegIterLoadTerm(Fts5Index *p, Fts5SegIter *pIter, int nKeep){
  u8 *a = pIter->pLeaf->p;        /* Buffer to read data from */
  int iOff = pIter->iLeafOffset;  /* Offset to read at */
  int nNew;                       /* Bytes of new data */

  iOff += fts5GetVarint32(&a[iOff], nNew);
  if( iOff+nNew>pIter->pLeaf->szLeaf || nKeep>pIter->term.n || nNew==0 ){
    p->rc = FTS5_CORRUPT;
    return;
  }
  pIter->term.n = nKeep;
  fts5BufferAppendBlob(&p->rc, &pIter->term, nNew, &a[iOff]);
  assert( pIter->term.n<=pIter->term.nSpace );
  iOff += nNew;
  pIter->iTermLeafOffset = iOff;
  pIter->iTermLeafPgno = pIter->iLeafPgno;
  pIter->iLeafOffset = iOff;

  if( pIter->iPgidxOff>=pIter->pLeaf->nn ){
    pIter->iEndofDoclist = pIter->pLeaf->nn+1;
  }else{
    int nExtra;
    pIter->iPgidxOff += fts5GetVarint32(&a[pIter->iPgidxOff], nExtra);
    pIter->iEndofDoclist += nExtra;
  }

  fts5SegIterLoadRowid(p, pIter);
}